

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::SliceStaticLayerParams::MergePartialFromCodedStream
          (SliceStaticLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  RepeatedField<long> *pRVar5;
  RepeatedField<bool> *pRVar6;
  char cVar7;
  ulong uVar8;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003bbc8d;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003bbc8d:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar8 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar4 | uVar8;
    }
    uVar4 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) goto switchD_003bbceb_default;
    cVar7 = (char)uVar8;
    switch((uint)(uVar8 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar7 == '\b') {
        uVar4 = 10;
        pRVar5 = &this->beginids_;
LAB_003bbde8:
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (1,uVar4,input,pRVar5);
      }
      else {
        pRVar5 = &this->beginids_;
        if ((uVar4 & 0xff) != 10) break;
LAB_003bbd44:
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input,pRVar5);
      }
      goto LAB_003bbcce;
    case 2:
      if (cVar7 != '\x10') {
        pRVar6 = &this->beginmasks_;
        if ((uVar4 & 0xff) == 0x12) {
LAB_003bbda2:
          bVar3 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (input,pRVar6);
          goto LAB_003bbcce;
        }
        break;
      }
      uVar4 = 0x12;
      pRVar6 = &this->beginmasks_;
LAB_003bbe0e:
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadRepeatedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                        (1,uVar4,input,pRVar6);
      goto LAB_003bbcce;
    case 3:
      if (cVar7 == '\x18') {
        uVar4 = 0x1a;
        pRVar5 = &this->endids_;
        goto LAB_003bbde8;
      }
      pRVar5 = &this->endids_;
      if ((uVar4 & 0xff) == 0x1a) goto LAB_003bbd44;
      break;
    case 4:
      if (cVar7 == ' ') {
        uVar4 = 0x22;
        pRVar6 = &this->endmasks_;
        goto LAB_003bbe0e;
      }
      pRVar6 = &this->endmasks_;
      if ((uVar4 & 0xff) == 0x22) goto LAB_003bbda2;
      break;
    case 5:
      if (cVar7 == '(') {
        uVar4 = 0x2a;
        pRVar5 = &this->strides_;
        goto LAB_003bbde8;
      }
      pRVar5 = &this->strides_;
      if ((uVar4 & 0xff) == 0x2a) goto LAB_003bbd44;
      break;
    case 6:
      if (cVar7 == '0') {
        uVar4 = 0x32;
        pRVar6 = &this->squeezemasks_;
        goto LAB_003bbe0e;
      }
      pRVar6 = &this->squeezemasks_;
      if ((uVar4 & 0xff) == 0x32) goto LAB_003bbda2;
    }
switchD_003bbceb_default:
    if (uVar4 == 0) {
      return true;
    }
    if ((uVar4 & 7) == 4) {
      return true;
    }
    bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
LAB_003bbcce:
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool SliceStaticLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.SliceStaticLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int64 beginIds = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_beginids())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 10u, input, this->mutable_beginids())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated bool beginMasks = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, this->mutable_beginmasks())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(16u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 1, 18u, input, this->mutable_beginmasks())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int64 endIds = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_endids())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(24u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 26u, input, this->mutable_endids())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated bool endMasks = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, this->mutable_endmasks())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(32u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 1, 34u, input, this->mutable_endmasks())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int64 strides = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_strides())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(40u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 42u, input, this->mutable_strides())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated bool squeezeMasks = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, this->mutable_squeezemasks())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(48u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 1, 50u, input, this->mutable_squeezemasks())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.SliceStaticLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.SliceStaticLayerParams)
  return false;
#undef DO_
}